

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

void __thiscall
GLRState::GLRState(GLRState *this,string *name,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *productions)

{
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *productions_local;
  string *name_local;
  GLRState *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->accepting = false;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            (&this->prodEstablished);
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            (&this->productions,productions);
  std::set<GLRTransition_*,_std::less<GLRTransition_*>,_std::allocator<GLRTransition_*>_>::set
            (&this->statesTo);
  return;
}

Assistant:

GLRState::GLRState(std::string name, std::set<Production *> productions) : name(std::move(name)),
                                                                           productions(std::move(productions)),
                                                                           accepting(false) {
//    prodEstablished = productions.size();
}